

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O0

bool wasm::PassRunner::passRemovesDebugInfo(string *name)

{
  bool bVar1;
  bool local_11;
  string *name_local;
  
  bVar1 = std::operator==(name,"strip");
  local_11 = true;
  if (!bVar1) {
    bVar1 = std::operator==(name,"strip-debug");
    local_11 = true;
    if (!bVar1) {
      local_11 = std::operator==(name,"strip-dwarf");
    }
  }
  return local_11;
}

Assistant:

bool PassRunner::passRemovesDebugInfo(const std::string& name) {
  return name == "strip" || name == "strip-debug" || name == "strip-dwarf";
}